

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-s-parser.cpp
# Opt level: O3

void __thiscall
wasm::SExpressionWasmBuilder::parseTag(SExpressionWasmBuilder *this,Element *s,bool preParseImport)

{
  pointer *ppNVar1;
  iterator __position;
  size_t sVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  char *pcVar5;
  bool bVar6;
  Tag *curr;
  Element *pEVar7;
  Tag *pTVar8;
  List *pLVar9;
  Element *pEVar10;
  Export *curr_00;
  Export *pEVar11;
  string *psVar12;
  undefined8 extraout_RAX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  size_t sVar13;
  string_view sVar14;
  Signature SVar15;
  IString str;
  IString str_00;
  undefined1 *local_178;
  long local_170;
  undefined1 local_168 [16];
  undefined1 *local_158;
  long local_150;
  undefined1 local_148 [16];
  undefined1 *local_138;
  long local_130;
  undefined1 local_128 [16];
  undefined1 *local_118;
  long local_110;
  undefined1 local_108 [16];
  undefined1 *local_f8;
  long local_f0;
  undefined1 local_e8 [16];
  undefined1 *local_d8;
  long local_d0;
  undefined1 local_c8 [16];
  undefined1 *local_b8;
  long local_b0;
  undefined1 local_a8 [16];
  undefined1 *local_98;
  long local_90;
  undefined1 local_88 [16];
  undefined1 *local_78;
  long local_70;
  undefined1 local_68 [16];
  HeapType local_58;
  HeapType tagType;
  
  curr = (Tag *)operator_new(0x48);
  (curr->super_Importable).super_Named.name.super_IString.str._M_len = 0;
  (curr->super_Importable).super_Named.name.super_IString.str._M_str = (char *)0x0;
  *(undefined8 *)&(curr->super_Importable).super_Named.hasExplicitName = 0;
  (curr->super_Importable).module.super_IString.str._M_len = 0;
  (curr->super_Importable).module.super_IString.str._M_str = (char *)0x0;
  (curr->super_Importable).base.super_IString.str._M_len = 0;
  (curr->super_Importable).base.super_IString.str._M_str = (char *)0x0;
  (curr->sig).params.id = 0;
  (curr->sig).results.id = 0;
  pEVar7 = Element::operator[](s,1);
  if (pEVar7->isList_ == false) {
    pEVar7 = Element::operator[](s,1);
    if ((pEVar7->isList_ != false) || ((pEVar7->dollared_ & 1U) == 0)) goto LAB_0098d5ee;
    pEVar7 = Element::operator[](s,1);
    sVar14 = (string_view)Element::str(pEVar7);
    (curr->super_Importable).super_Named.name.super_IString.str = sVar14;
    (curr->super_Importable).super_Named.hasExplicitName = true;
    pTVar8 = Module::getTagOrNull(this->wasm,(Name)sVar14);
    sVar13 = 2;
    if (pTVar8 != (Tag *)0x0) {
      psVar12 = (string *)__cxa_allocate_exception(0x30);
      local_178 = local_168;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"duplicate tag","");
      sVar13 = pEVar7->line;
      uVar3 = *(undefined4 *)((long)&pEVar7->line + 4);
      sVar2 = pEVar7->col;
      uVar4 = *(undefined4 *)((long)&pEVar7->col + 4);
      *(string **)psVar12 = psVar12 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar12,local_178,local_178 + local_170);
      *(int *)(psVar12 + 0x20) = (int)sVar13;
      *(undefined4 *)(psVar12 + 0x24) = uVar3;
      *(int *)(psVar12 + 0x28) = (int)sVar2;
      *(undefined4 *)(psVar12 + 0x2c) = uVar4;
      __cxa_throw(psVar12,&ParseException::typeinfo,ParseException::~ParseException);
    }
  }
  else {
LAB_0098d5ee:
    sVar14 = (string_view)Name::fromInt((long)this->tagCounter);
    (curr->super_Importable).super_Named.name.super_IString.str = sVar14;
    pTVar8 = Module::getTagOrNull(this->wasm,(Name)sVar14);
    sVar13 = 1;
    if (pTVar8 != (Tag *)0x0) {
      __assert_fail("!wasm.getTagOrNull(tag->name)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-s-parser.cpp"
                    ,0xf78,"void wasm::SExpressionWasmBuilder::parseTag(Element &, bool)");
    }
  }
  this->tagCounter = this->tagCounter + 1;
  __position._M_current =
       (this->tagNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->tagNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
              ((vector<wasm::Name,std::allocator<wasm::Name>> *)&this->tagNames,__position,
               (Name *)curr);
  }
  else {
    pcVar5 = (curr->super_Importable).super_Named.name.super_IString.str._M_str;
    ((__position._M_current)->super_IString).str._M_len =
         (curr->super_Importable).super_Named.name.super_IString.str._M_len;
    ((__position._M_current)->super_IString).str._M_str = pcVar5;
    ppNVar1 = &(this->tagNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppNVar1 = *ppNVar1 + 1;
  }
  pLVar9 = Element::list(s);
  if (sVar13 < (pLVar9->super_ArenaVectorBase<ArenaVector<wasm::Element_*>,_wasm::Element_*>).
               usedElements) {
    pEVar7 = Element::operator[](s,(uint)sVar13);
    str.str._M_str = extraout_RDX;
    str.str._M_len = DAT_00da7ef0;
    bVar6 = elementStartsWith(pEVar7,str);
    if (bVar6) {
      if (!preParseImport) {
        __assert_fail("preParseImport && \"import element in non-preParseImport mode\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-s-parser.cpp"
                      ,0xf7f,"void wasm::SExpressionWasmBuilder::parseTag(Element &, bool)");
      }
      pEVar7 = Element::operator[](s,(uint)sVar13);
      pLVar9 = Element::list(pEVar7);
      if ((pLVar9->super_ArenaVectorBase<ArenaVector<wasm::Element_*>,_wasm::Element_*>).
          usedElements != 3) {
        psVar12 = (string *)__cxa_allocate_exception(0x30);
        local_158 = local_148;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"invalid import","");
        sVar13 = pEVar7->line;
        uVar3 = *(undefined4 *)((long)&pEVar7->line + 4);
        sVar2 = pEVar7->col;
        uVar4 = *(undefined4 *)((long)&pEVar7->col + 4);
        *(string **)psVar12 = psVar12 + 0x10;
        std::__cxx11::string::_M_construct<char*>(psVar12,local_158,local_158 + local_150);
        *(int *)(psVar12 + 0x20) = (int)sVar13;
        *(undefined4 *)(psVar12 + 0x24) = uVar3;
        *(int *)(psVar12 + 0x28) = (int)sVar2;
        *(undefined4 *)(psVar12 + 0x2c) = uVar4;
        __cxa_throw(psVar12,&ParseException::typeinfo,ParseException::~ParseException);
      }
      pEVar10 = Element::operator[](pEVar7,1);
      if (pEVar10->isList_ != false) {
LAB_0098d9c4:
        psVar12 = (string *)__cxa_allocate_exception(0x30);
        local_138 = local_128;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_138,"invalid import module name","");
        pEVar10 = Element::operator[](pEVar7,1);
        sVar13 = pEVar10->line;
        pEVar7 = Element::operator[](pEVar7,1);
        sVar2 = pEVar7->col;
        *(string **)psVar12 = psVar12 + 0x10;
        std::__cxx11::string::_M_construct<char*>(psVar12,local_138,local_138 + local_130);
        *(size_t *)(psVar12 + 0x20) = sVar13;
        *(size_t *)(psVar12 + 0x28) = sVar2;
        __cxa_throw(psVar12,&ParseException::typeinfo,ParseException::~ParseException);
      }
      pEVar10 = Element::operator[](pEVar7,1);
      if ((pEVar10->isList_ == false) && ((pEVar10->dollared_ & 1U) != 0)) goto LAB_0098d9c4;
      pEVar10 = Element::operator[](pEVar7,2);
      if (pEVar10->isList_ != false) {
LAB_0098da6b:
        psVar12 = (string *)__cxa_allocate_exception(0x30);
        local_118 = local_108;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_118,"invalid import base name","");
        pEVar10 = Element::operator[](pEVar7,2);
        sVar13 = pEVar10->line;
        pEVar7 = Element::operator[](pEVar7,2);
        sVar2 = pEVar7->col;
        *(string **)psVar12 = psVar12 + 0x10;
        std::__cxx11::string::_M_construct<char*>(psVar12,local_118,local_118 + local_110);
        *(size_t *)(psVar12 + 0x20) = sVar13;
        *(size_t *)(psVar12 + 0x28) = sVar2;
        __cxa_throw(psVar12,&ParseException::typeinfo,ParseException::~ParseException);
      }
      pEVar10 = Element::operator[](pEVar7,2);
      if ((pEVar10->isList_ == false) && ((pEVar10->dollared_ & 1U) != 0)) goto LAB_0098da6b;
      pEVar10 = Element::operator[](pEVar7,1);
      sVar14 = (string_view)Element::str(pEVar10);
      (curr->super_Importable).module.super_IString.str = sVar14;
      pEVar7 = Element::operator[](pEVar7,2);
      sVar14 = (string_view)Element::str(pEVar7);
      sVar13 = sVar13 + 1;
      (curr->super_Importable).base.super_IString.str = sVar14;
    }
  }
  pLVar9 = Element::list(s);
  if (sVar13 < (pLVar9->super_ArenaVectorBase<ArenaVector<wasm::Element_*>,_wasm::Element_*>).
               usedElements) {
    pEVar7 = Element::operator[](s,(uint)sVar13);
    str_00.str._M_str = extraout_RDX_00;
    str_00.str._M_len = DAT_00da7ee0;
    bVar6 = elementStartsWith(pEVar7,str_00);
    if (bVar6) {
      pEVar7 = Element::operator[](s,(uint)sVar13);
      if ((curr->super_Importable).module.super_IString.str._M_str != (char *)0x0) {
        psVar12 = (string *)__cxa_allocate_exception(0x30);
        local_f8 = local_e8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f8,"import and export cannot be specified together","");
        sVar13 = pEVar7->line;
        uVar3 = *(undefined4 *)((long)&pEVar7->line + 4);
        sVar2 = pEVar7->col;
        uVar4 = *(undefined4 *)((long)&pEVar7->col + 4);
        *(string **)psVar12 = psVar12 + 0x10;
        std::__cxx11::string::_M_construct<char*>(psVar12,local_f8,local_f8 + local_f0);
        *(int *)(psVar12 + 0x20) = (int)sVar13;
        *(undefined4 *)(psVar12 + 0x24) = uVar3;
        *(int *)(psVar12 + 0x28) = (int)sVar2;
        *(undefined4 *)(psVar12 + 0x2c) = uVar4;
        __cxa_throw(psVar12,&ParseException::typeinfo,ParseException::~ParseException);
      }
      pLVar9 = Element::list(pEVar7);
      if ((pLVar9->super_ArenaVectorBase<ArenaVector<wasm::Element_*>,_wasm::Element_*>).
          usedElements != 2) {
        psVar12 = (string *)__cxa_allocate_exception(0x30);
        local_d8 = local_c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"invalid export","");
        sVar13 = pEVar7->line;
        uVar3 = *(undefined4 *)((long)&pEVar7->line + 4);
        sVar2 = pEVar7->col;
        uVar4 = *(undefined4 *)((long)&pEVar7->col + 4);
        *(string **)psVar12 = psVar12 + 0x10;
        std::__cxx11::string::_M_construct<char*>(psVar12,local_d8,local_d8 + local_d0);
        *(int *)(psVar12 + 0x20) = (int)sVar13;
        *(undefined4 *)(psVar12 + 0x24) = uVar3;
        *(int *)(psVar12 + 0x28) = (int)sVar2;
        *(undefined4 *)(psVar12 + 0x2c) = uVar4;
        __cxa_throw(psVar12,&ParseException::typeinfo,ParseException::~ParseException);
      }
      pEVar10 = Element::operator[](pEVar7,1);
      if (pEVar10->isList_ == false) {
        pEVar10 = Element::operator[](pEVar7,1);
        if ((pEVar10->isList_ != false) || ((pEVar10->dollared_ & 1U) == 0)) {
          curr_00 = (Export *)operator_new(0x28);
          (curr_00->value).super_IString.str._M_len = 0;
          (curr_00->value).super_IString.str._M_str = (char *)0x0;
          (curr_00->name).super_IString.str._M_len = 0;
          (curr_00->name).super_IString.str._M_str = (char *)0x0;
          *(undefined8 *)&curr_00->kind = 0;
          pEVar10 = Element::operator[](pEVar7,1);
          sVar14 = (string_view)Element::str(pEVar10);
          (curr_00->name).super_IString.str = sVar14;
          pEVar11 = Module::getExportOrNull(this->wasm,(Name)sVar14);
          if (pEVar11 != (Export *)0x0) {
            psVar12 = (string *)__cxa_allocate_exception(0x30);
            local_98 = local_88;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_98,"duplicate export","");
            tagType.id._0_4_ = (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
            pEVar10 = Element::operator[](pEVar7,1);
            sVar13 = pEVar10->line;
            pEVar7 = Element::operator[](pEVar7,1);
            sVar2 = pEVar7->col;
            *(string **)psVar12 = psVar12 + 0x10;
            std::__cxx11::string::_M_construct<char*>(psVar12,local_98,local_98 + local_90);
            *(size_t *)(psVar12 + 0x20) = sVar13;
            *(size_t *)(psVar12 + 0x28) = sVar2;
            tagType.id = tagType.id & 0xffffffff00000000;
            __cxa_throw(psVar12,&ParseException::typeinfo,ParseException::~ParseException);
          }
          pcVar5 = (curr->super_Importable).super_Named.name.super_IString.str._M_str;
          (curr_00->value).super_IString.str._M_len =
               (curr->super_Importable).super_Named.name.super_IString.str._M_len;
          (curr_00->value).super_IString.str._M_str = pcVar5;
          curr_00->kind = Tag;
          Module::addExport(this->wasm,curr_00);
          sVar13 = sVar13 + 1;
          goto LAB_0098d8ce;
        }
      }
      psVar12 = (string *)__cxa_allocate_exception(0x30);
      local_b8 = local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"invalid export name","");
      pEVar10 = Element::operator[](pEVar7,1);
      sVar13 = pEVar10->line;
      pEVar7 = Element::operator[](pEVar7,1);
      sVar2 = pEVar7->col;
      *(string **)psVar12 = psVar12 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar12,local_b8,local_b8 + local_b0);
      *(size_t *)(psVar12 + 0x20) = sVar13;
      *(size_t *)(psVar12 + 0x28) = sVar2;
      __cxa_throw(psVar12,&ParseException::typeinfo,ParseException::~ParseException);
    }
  }
LAB_0098d8ce:
  local_58.id = 1;
  sVar13 = parseTypeUse(this,s,sVar13,&local_58);
  SVar15 = HeapType::getSignature(&local_58);
  curr->sig = SVar15;
  pLVar9 = Element::list(s);
  if ((pLVar9->super_ArenaVectorBase<ArenaVector<wasm::Element_*>,_wasm::Element_*>).usedElements <=
      sVar13) {
    Module::addTag(this->wasm,curr);
    return;
  }
  psVar12 = (string *)__cxa_allocate_exception(0x30);
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"invalid element","");
  pEVar7 = Element::operator[](s,(uint)sVar13);
  tagType.id = pEVar7->line;
  pEVar7 = Element::operator[](s,(uint)sVar13);
  sVar13 = pEVar7->col;
  *(string **)psVar12 = psVar12 + 0x10;
  std::__cxx11::string::_M_construct<char*>(psVar12,local_78,local_78 + local_70);
  *(uintptr_t *)(psVar12 + 0x20) = tagType.id;
  *(size_t *)(psVar12 + 0x28) = sVar13;
  __cxa_throw(psVar12,&ParseException::typeinfo,ParseException::~ParseException);
}

Assistant:

void SExpressionWasmBuilder::parseTag(Element& s, bool preParseImport) {
  auto tag = std::make_unique<Tag>();
  size_t i = 1;

  // Parse name
  if (s[i]->isStr() && s[i]->dollared()) {
    auto& inner = *s[i++];
    tag->setExplicitName(inner.str());
    if (wasm.getTagOrNull(tag->name)) {
      throw ParseException("duplicate tag", inner.line, inner.col);
    }
  } else {
    tag->name = Name::fromInt(tagCounter);
    assert(!wasm.getTagOrNull(tag->name));
  }
  tagCounter++;
  tagNames.push_back(tag->name);

  // Parse import, if any
  if (i < s.size() && elementStartsWith(*s[i], IMPORT)) {
    assert(preParseImport && "import element in non-preParseImport mode");
    auto& importElem = *s[i++];
    if (importElem.size() != 3) {
      throw ParseException("invalid import", importElem.line, importElem.col);
    }
    if (!importElem[1]->isStr() || importElem[1]->dollared()) {
      throw ParseException(
        "invalid import module name", importElem[1]->line, importElem[1]->col);
    }
    if (!importElem[2]->isStr() || importElem[2]->dollared()) {
      throw ParseException(
        "invalid import base name", importElem[2]->line, importElem[2]->col);
    }
    tag->module = importElem[1]->str();
    tag->base = importElem[2]->str();
  }

  // Parse export, if any
  if (i < s.size() && elementStartsWith(*s[i], EXPORT)) {
    auto& exportElem = *s[i++];
    if (tag->module.is()) {
      throw ParseException("import and export cannot be specified together",
                           exportElem.line,
                           exportElem.col);
    }
    if (exportElem.size() != 2) {
      throw ParseException("invalid export", exportElem.line, exportElem.col);
    }
    if (!exportElem[1]->isStr() || exportElem[1]->dollared()) {
      throw ParseException(
        "invalid export name", exportElem[1]->line, exportElem[1]->col);
    }
    auto ex = std::make_unique<Export>();
    ex->name = exportElem[1]->str();
    if (wasm.getExportOrNull(ex->name)) {
      throw ParseException(
        "duplicate export", exportElem[1]->line, exportElem[1]->col);
    }
    ex->value = tag->name;
    ex->kind = ExternalKind::Tag;
    wasm.addExport(ex.release());
  }

  // Parse typeuse
  HeapType tagType;
  i = parseTypeUse(s, i, tagType);
  tag->sig = tagType.getSignature();

  // If there are more elements, they are invalid
  if (i < s.size()) {
    throw ParseException("invalid element", s[i]->line, s[i]->col);
  }

  wasm.addTag(tag.release());
}